

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O3

void fld_import(limb_t *dst,uint8_t *src)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  lVar3 = 0;
  iVar6 = 0;
  uVar5 = 0;
  do {
    iVar4 = iVar6;
    if (iVar6 < 0x33) {
      do {
        bVar1 = *src;
        src = src + 1;
        uVar5 = uVar5 | (ulong)bVar1 << ((byte)iVar4 & 0x3f);
        iVar6 = iVar4 + 8;
        bVar2 = iVar4 < 0x2b;
        iVar4 = iVar6;
      } while (bVar2);
    }
    dst[lVar3] = uVar5 & 0x7ffffffffffff;
    uVar5 = uVar5 >> 0x33;
    iVar6 = iVar6 + -0x33;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  *dst = *dst + uVar5 * 0x13;
  return;
}

Assistant:

void
fld_import(fld_t dst, const uint8_t src[32])
{
	int i;
	uint64_t tmp = 0;
	int fill = 0;

	for (i = 0; i < FLD_LIMB_NUM; i++) {
		for (;fill < FLD_LIMB_BITS; fill += 8)
			tmp |= (uint64_t)*src++ << fill;

		dst[i] = tmp & FLD_LIMB_MASK;
		tmp >>= FLD_LIMB_BITS;
		fill -= FLD_LIMB_BITS;
	}
	dst[0] += 19*tmp;

	/* dst is now reduced and partially carried (first limb may
	 * use 52bits instead of 51).
	 */
}